

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O1

void ncnn::gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  float fVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  int *piVar25;
  float fVar26;
  int iVar27;
  float extraout_XMM0_Db;
  int iVar35;
  undefined1 auVar28 [16];
  float extraout_XMM0_Db_00;
  int iVar34;
  int iVar36;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  int iVar43;
  undefined1 auVar39 [16];
  int iVar38;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  long local_90;
  float fStack_54;
  
  iVar18 = grid->h * grid->w * grid->d;
  piVar25 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    if (0 < grid->c) {
      sVar8 = grid->cstep;
      local_90 = (long)grid->data + 8;
      sVar9 = grid->elemsize;
      lVar12 = 0;
      do {
        if (0 < iVar18) {
          lVar24 = 0;
          do {
            iVar17 = src->d;
            fVar37 = (float)(iVar17 + -1) * (*(float *)(local_90 + lVar24 * 4) * 0.5 + 0.5);
            if (fVar37 <= 0.0) {
              fVar37 = 0.0;
            }
            fVar10 = (float)iVar17 + -1.0;
            if (fVar37 <= (float)iVar17 + -1.0) {
              fVar10 = fVar37;
            }
            uVar4 = *(undefined8 *)(local_90 + -8 + lVar24 * 4);
            uVar3 = src->w;
            uVar6 = src->h;
            auVar40._0_4_ = (float)(uVar3 + -1) * ((float)uVar4 * 0.5 + 0.5);
            auVar40._4_4_ = (float)(uVar6 + -1) * ((float)((ulong)uVar4 >> 0x20) * 0.5 + 0.5);
            auVar40._8_4_ = 0x80000000;
            auVar40._12_4_ = 0x80000000;
            auVar41 = maxps(auVar40,_DAT_005f00d0);
            auVar51._0_4_ = (float)(int)uVar3 + -1.0;
            auVar51._4_4_ = (float)(int)uVar6 + -1.0;
            auVar51._8_8_ = 0;
            auVar51 = minps(auVar51,auVar41);
            fVar37 = floorf(auVar51._0_4_);
            fStack_54 = auVar51._4_4_;
            fVar26 = floorf(fStack_54);
            iVar27 = (int)fVar37;
            iVar34 = (int)fVar26;
            iVar35 = (int)extraout_XMM0_Db_01;
            iVar36 = (int)extraout_XMM0_Db_02;
            fVar37 = floorf(fVar10);
            iVar11 = (int)fVar37;
            iVar1 = iVar11 + 1;
            bVar16 = iVar11 < iVar17 && -1 < iVar11;
            auVar41._0_4_ = -(uint)(-1 < iVar27);
            auVar41._4_4_ = -(uint)(-1 < iVar34);
            auVar41._8_4_ = -(uint)(-1 < iVar35);
            auVar41._12_4_ = -(uint)(-1 < iVar36);
            auVar42._0_4_ = -(uint)(iVar27 < (int)uVar3);
            auVar42._4_4_ = -(uint)(iVar34 < (int)uVar6);
            auVar42._8_4_ = -(uint)(iVar35 < 0);
            auVar42._12_4_ = -(uint)(iVar36 < 0);
            auVar42 = auVar42 & auVar41;
            auVar32._0_8_ = auVar42._0_8_;
            auVar32._8_4_ = auVar42._4_4_;
            auVar32._12_4_ = auVar42._12_4_;
            auVar33._0_8_ = auVar32._0_8_ << 0x3f;
            auVar33._8_8_ = auVar32._8_8_ << 0x3f;
            uVar13 = movmskpd((int)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),-1 < iVar11),auVar33
                             );
            uVar21 = uVar13 >> 1 & 0x7f;
            uVar15 = uVar21 & uVar13 & 1;
            iVar22 = -1;
            iVar19 = -1;
            uVar20 = (uint)bVar16;
            if ((uVar15 & uVar20) != 0) {
              iVar19 = (uVar3 * (iVar34 + uVar6 * iVar11) + iVar27) * src->elempack;
            }
            iVar38 = iVar27 + 1;
            iVar43 = iVar34 + 1;
            auVar47._0_4_ = -(uint)(-2 < iVar27);
            auVar47._4_4_ = -(uint)(-2 < iVar34);
            auVar47._8_4_ = -(uint)(0 < iVar35);
            auVar47._12_4_ = -(uint)(0 < iVar36);
            auVar53._0_4_ = -(uint)(iVar38 < (int)uVar3);
            auVar53._4_4_ = -(uint)(iVar43 < (int)uVar6);
            auVar53._8_4_ = -(uint)(iVar35 + 1 < 0);
            auVar53._12_4_ = -(uint)(iVar36 + 1 < 0);
            auVar53 = auVar53 & auVar47;
            auVar48._0_8_ = auVar53._0_8_;
            auVar48._8_4_ = auVar53._4_4_;
            auVar48._12_4_ = auVar53._12_4_;
            auVar49._0_8_ = auVar48._0_8_ << 0x3f;
            auVar49._8_8_ = auVar48._8_8_ << 0x3f;
            uVar14 = movmskpd(iVar27,auVar49);
            uVar21 = uVar21 & uVar14 & 1;
            *piVar25 = iVar19;
            if ((uVar21 & uVar20) != 0) {
              iVar22 = ((iVar34 + src->h * iVar11) * src->w + iVar38) * src->elempack;
            }
            uVar23 = uVar14 >> 1 & 0x7f;
            uVar13 = uVar13 & 1 & uVar23;
            piVar25[1] = iVar22;
            iVar22 = -1;
            iVar19 = -1;
            uVar20 = (uint)bVar16;
            if ((uVar13 & uVar20) != 0) {
              iVar19 = ((iVar43 + src->h * iVar11) * src->w + iVar27) * src->elempack;
            }
            uVar23 = uVar23 & uVar14 & 1;
            piVar25[2] = iVar19;
            if ((uVar23 & uVar20) != 0) {
              iVar22 = ((iVar43 + src->h * iVar11) * src->w + iVar38) * src->elempack;
            }
            bVar16 = -2 < iVar11 && iVar1 < iVar17;
            piVar25[3] = iVar22;
            iVar19 = -1;
            iVar17 = -1;
            uVar20 = (uint)bVar16;
            if ((uVar15 & uVar20) != 0) {
              iVar17 = ((iVar34 + src->h * iVar1) * src->w + iVar27) * src->elempack;
            }
            piVar25[4] = iVar17;
            if ((uVar21 & uVar20) != 0) {
              iVar19 = ((iVar34 + src->h * iVar1) * src->w + iVar38) * src->elempack;
            }
            piVar25[5] = iVar19;
            iVar19 = -1;
            iVar17 = -1;
            uVar20 = (uint)bVar16;
            if ((uVar13 & uVar20) != 0) {
              iVar17 = ((iVar43 + src->h * iVar1) * src->w + iVar27) * src->elempack;
            }
            piVar25[6] = iVar17;
            if ((uVar23 & uVar20) != 0) {
              iVar19 = ((iVar43 + iVar1 * src->h) * src->w + iVar38) * src->elempack;
            }
            piVar25[7] = iVar19;
            *(ulong *)(piVar25 + 8) =
                 CONCAT44(fStack_54 - (float)iVar34,auVar51._0_4_ - (float)iVar27);
            piVar25[10] = (int)(fVar10 - (float)iVar11);
            piVar25 = piVar25 + 0xb;
            lVar24 = lVar24 + 3;
          } while ((int)lVar24 < iVar18);
        }
        lVar12 = lVar12 + 1;
        local_90 = local_90 + sVar8 * sVar9;
      } while (lVar12 < grid->c);
    }
  }
  else if (0 < iVar18) {
    pvVar7 = grid->data;
    lVar12 = grid->elemsize * grid->cstep;
    lVar24 = 0;
    do {
      iVar17 = src->d;
      fVar37 = (float)(iVar17 + -1) *
               (*(float *)((long)pvVar7 + lVar24 * 4 + lVar12 * 2) * 0.5 + 0.5);
      if (fVar37 <= 0.0) {
        fVar37 = 0.0;
      }
      fVar10 = (float)iVar17 + -1.0;
      if (fVar37 <= (float)iVar17 + -1.0) {
        fVar10 = fVar37;
      }
      uVar2 = src->w;
      uVar5 = src->h;
      auVar50._0_4_ = (float)(uVar2 + -1) * (*(float *)((long)pvVar7 + lVar24 * 4) * 0.5 + 0.5);
      auVar50._4_4_ =
           (float)(uVar5 + -1) * (*(float *)((long)pvVar7 + lVar24 * 4 + lVar12) * 0.5 + 0.5);
      auVar50._8_4_ = 0x80000000;
      auVar50._12_4_ = 0x80000000;
      auVar51 = maxps(auVar50,_DAT_005f00d0);
      auVar28._0_4_ = (float)(int)uVar2 + -1.0;
      auVar28._4_4_ = (float)(int)uVar5 + -1.0;
      auVar28._8_8_ = 0;
      auVar51 = minps(auVar28,auVar51);
      fVar37 = floorf(auVar51._0_4_);
      fStack_54 = auVar51._4_4_;
      fVar26 = floorf(fStack_54);
      iVar27 = (int)fVar37;
      iVar34 = (int)fVar26;
      iVar35 = (int)extraout_XMM0_Db;
      iVar36 = (int)extraout_XMM0_Db_00;
      fVar37 = floorf(fVar10);
      iVar11 = (int)fVar37;
      iVar1 = iVar11 + 1;
      bVar16 = iVar11 < iVar17 && -1 < iVar11;
      auVar29._0_4_ = -(uint)(-1 < iVar27);
      auVar29._4_4_ = -(uint)(-1 < iVar34);
      auVar29._8_4_ = -(uint)(-1 < iVar35);
      auVar29._12_4_ = -(uint)(-1 < iVar36);
      auVar39._0_4_ = -(uint)(iVar27 < (int)uVar2);
      auVar39._4_4_ = -(uint)(iVar34 < (int)uVar5);
      auVar39._8_4_ = -(uint)(iVar35 < 0);
      auVar39._12_4_ = -(uint)(iVar36 < 0);
      auVar39 = auVar39 & auVar29;
      auVar30._0_8_ = auVar39._0_8_;
      auVar30._8_4_ = auVar39._4_4_;
      auVar30._12_4_ = auVar39._12_4_;
      auVar31._0_8_ = auVar30._0_8_ << 0x3f;
      auVar31._8_8_ = auVar30._8_8_ << 0x3f;
      uVar13 = movmskpd((int)CONCAT71((int7)((ulong)extraout_RDX >> 8),-1 < iVar11),auVar31);
      uVar20 = uVar13 >> 1 & 0x7f;
      uVar21 = uVar20 & uVar13 & 1;
      iVar22 = -1;
      iVar19 = -1;
      uVar15 = (uint)bVar16;
      if ((uVar21 & uVar15) != 0) {
        iVar19 = (uVar2 * (iVar34 + uVar5 * iVar11) + iVar27) * src->elempack;
      }
      iVar38 = iVar27 + 1;
      iVar43 = iVar34 + 1;
      auVar44._0_4_ = -(uint)(-2 < iVar27);
      auVar44._4_4_ = -(uint)(-2 < iVar34);
      auVar44._8_4_ = -(uint)(0 < iVar35);
      auVar44._12_4_ = -(uint)(0 < iVar36);
      auVar52._0_4_ = -(uint)(iVar38 < (int)uVar2);
      auVar52._4_4_ = -(uint)(iVar43 < (int)uVar5);
      auVar52._8_4_ = -(uint)(iVar35 + 1 < 0);
      auVar52._12_4_ = -(uint)(iVar36 + 1 < 0);
      auVar52 = auVar52 & auVar44;
      auVar45._0_8_ = auVar52._0_8_;
      auVar45._8_4_ = auVar52._4_4_;
      auVar45._12_4_ = auVar52._12_4_;
      auVar46._0_8_ = auVar45._0_8_ << 0x3f;
      auVar46._8_8_ = auVar45._8_8_ << 0x3f;
      uVar14 = movmskpd(iVar27,auVar46);
      uVar20 = uVar20 & uVar14 & 1;
      *piVar25 = iVar19;
      if ((uVar20 & uVar15) != 0) {
        iVar22 = ((iVar34 + src->h * iVar11) * src->w + iVar38) * src->elempack;
      }
      uVar15 = uVar14 >> 1 & 0x7f;
      uVar13 = uVar13 & 1 & uVar15;
      piVar25[1] = iVar22;
      iVar22 = -1;
      iVar19 = -1;
      uVar23 = (uint)bVar16;
      if ((uVar13 & uVar23) != 0) {
        iVar19 = ((iVar43 + src->h * iVar11) * src->w + iVar27) * src->elempack;
      }
      uVar15 = uVar15 & uVar14 & 1;
      piVar25[2] = iVar19;
      if ((uVar15 & uVar23) != 0) {
        iVar22 = ((iVar43 + src->h * iVar11) * src->w + iVar38) * src->elempack;
      }
      bVar16 = -2 < iVar11 && iVar1 < iVar17;
      piVar25[3] = iVar22;
      iVar19 = -1;
      iVar17 = -1;
      uVar14 = (uint)bVar16;
      if ((uVar21 & uVar14) != 0) {
        iVar17 = ((iVar34 + src->h * iVar1) * src->w + iVar27) * src->elempack;
      }
      piVar25[4] = iVar17;
      if ((uVar20 & uVar14) != 0) {
        iVar19 = ((iVar34 + src->h * iVar1) * src->w + iVar38) * src->elempack;
      }
      piVar25[5] = iVar19;
      iVar19 = -1;
      iVar17 = -1;
      uVar20 = (uint)bVar16;
      if ((uVar13 & uVar20) != 0) {
        iVar17 = ((iVar43 + src->h * iVar1) * src->w + iVar27) * src->elempack;
      }
      piVar25[6] = iVar17;
      if ((uVar15 & uVar20) != 0) {
        iVar19 = ((iVar43 + iVar1 * src->h) * src->w + iVar38) * src->elempack;
      }
      piVar25[7] = iVar19;
      *(ulong *)(piVar25 + 8) = CONCAT44(fStack_54 - (float)iVar34,auVar51._0_4_ - (float)iVar27);
      piVar25[10] = (int)(fVar10 - (float)iVar11);
      piVar25 = piVar25 + 0xb;
      lVar24 = lVar24 + 1;
    } while (iVar18 != (int)lVar24);
  }
  return;
}

Assistant:

void gridsample_3d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);
                __m256 z_t = _mm256_floor_ps(gz);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
                __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
                __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
                __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

                __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
                {
                    __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                    __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                    __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                    __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                    v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                    v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                    v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                    v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                    v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                    v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                    v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                    v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
                }

                __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                                  _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                                  _mm256_set1_ps(src.elempack));
                __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
                __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

                __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
                __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
                __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

                tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
                tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
                tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
                tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

                bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
                bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
                bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
                bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

                tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
                tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
                tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
                tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

                bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
                bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
                bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
                bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);
                __m256 gamma = _mm256_sub_ps(gz, z_t);

                transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

                _mm256_storeu_ps(offset_value_ptr, tnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
                _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

                _mm256_storeu_ps(offset_value_ptr + 64, alpha);
                _mm256_storeu_ps(offset_value_ptr + 72, beta);
                _mm256_storeu_ps(offset_value_ptr + 80, gamma);

                gridptr += 24;

                offset_value_ptr += 88;
            }
#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int z0 = (int)floorf(sample_z);
                int x1 = x0 + 1;
                int y1 = y0 + 1;
                int z1 = z0 + 1;

                bool x0_in_range = (x0 > -1) & (x0 < src.w);
                bool y0_in_range = (y0 > -1) & (y0 < src.h);
                bool z0_in_range = (z0 > -1) & (z0 < src.d);
                bool x1_in_range = (x1 > -1) & (x1 < src.w);
                bool y1_in_range = (y1 > -1) & (y1 < src.h);
                bool z1_in_range = (z1 > -1) & (z1 < src.d);

                bool v00_in_range = x0_in_range & y0_in_range;
                bool v01_in_range = x1_in_range & y0_in_range;
                bool v10_in_range = x0_in_range & y1_in_range;
                bool v11_in_range = x1_in_range & y1_in_range;

                bool in_bound_000 = v00_in_range & z0_in_range;
                bool in_bound_001 = v01_in_range & z0_in_range;
                bool in_bound_010 = v10_in_range & z0_in_range;
                bool in_bound_011 = v11_in_range & z0_in_range;

                bool in_bound_100 = v00_in_range & z1_in_range;
                bool in_bound_101 = v01_in_range & z1_in_range;
                bool in_bound_110 = v10_in_range & z1_in_range;
                bool in_bound_111 = v11_in_range & z1_in_range;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 8;

                offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;
                value_ptr[2] = sample_z - z0;

                gridptr += 3;
                offset_value_ptr += 11;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);
            __m256 z_t = _mm256_floor_ps(gz);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
            __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
            __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
            __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

            __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
            {
                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
            }

            __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                              _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                              _mm256_set1_ps(src.elempack));
            __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
            __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

            __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
            __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
            __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

            tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
            tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
            tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
            tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

            bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
            bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
            bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
            bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

            tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
            tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
            tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
            tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

            bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
            bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
            bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
            bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);
            __m256 gamma = _mm256_sub_ps(gz, z_t);

            transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

            _mm256_storeu_ps(offset_value_ptr, tnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
            _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

            _mm256_storeu_ps(offset_value_ptr + 64, alpha);
            _mm256_storeu_ps(offset_value_ptr + 72, beta);
            _mm256_storeu_ps(offset_value_ptr + 80, gamma);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_value_ptr += 88;
        }
#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int z0 = (int)floorf(sample_z);
            int x1 = x0 + 1;
            int y1 = y0 + 1;
            int z1 = z0 + 1;

            bool x0_in_range = (x0 > -1) & (x0 < src.w);
            bool y0_in_range = (y0 > -1) & (y0 < src.h);
            bool z0_in_range = (z0 > -1) & (z0 < src.d);
            bool x1_in_range = (x1 > -1) & (x1 < src.w);
            bool y1_in_range = (y1 > -1) & (y1 < src.h);
            bool z1_in_range = (z1 > -1) & (z1 < src.d);

            bool v00_in_range = x0_in_range & y0_in_range;
            bool v01_in_range = x1_in_range & y0_in_range;
            bool v10_in_range = x0_in_range & y1_in_range;
            bool v11_in_range = x1_in_range & y1_in_range;

            bool in_bound_000 = v00_in_range & z0_in_range;
            bool in_bound_001 = v01_in_range & z0_in_range;
            bool in_bound_010 = v10_in_range & z0_in_range;
            bool in_bound_011 = v11_in_range & z0_in_range;

            bool in_bound_100 = v00_in_range & z1_in_range;
            bool in_bound_101 = v01_in_range & z1_in_range;
            bool in_bound_110 = v10_in_range & z1_in_range;
            bool in_bound_111 = v11_in_range & z1_in_range;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 8;

            offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;
            value_ptr[2] = sample_z - z0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;
            offset_value_ptr += 11;
        }
    }
}